

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow-c.cpp
# Opt level: O3

duckdb_state
duckdb_execute_prepared_arrow(duckdb_prepared_statement prepared_statement,duckdb_arrow *out_result)

{
  tuple<duckdb::MaterializedQueryResult_*,_std::default_delete<duckdb::MaterializedQueryResult>_>
  tVar1;
  bool bVar2;
  pointer pPVar3;
  duckdb_arrow this;
  pointer this_00;
  duckdb_state dVar4;
  _Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false> local_30;
  
  dVar4 = DuckDBError;
  if ((prepared_statement != (duckdb_prepared_statement)0x0) &&
     (*(long *)(prepared_statement + 0x38) != 0)) {
    pPVar3 = duckdb::
             unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
             ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                           *)(prepared_statement + 0x38));
    bVar2 = duckdb::PreparedStatement::HasError(pPVar3);
    if ((out_result != (duckdb_arrow *)0x0) && (!bVar2)) {
      this = (duckdb_arrow)operator_new(0x10);
      *(__uniq_ptr_data<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true,_true>
        *)this = (__uniq_ptr_data<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true,_true>
                  )0x0;
      *(__uniq_ptr_data<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true,_true>
        *)(this + 8) =
           (__uniq_ptr_data<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true,_true>
            )0x0;
      pPVar3 = duckdb::
               unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
               ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                             *)(prepared_statement + 0x38));
      duckdb::PreparedStatement::Execute
                ((PreparedStatement *)&stack0xffffffffffffffd0,
                 (case_insensitive_map_t<BoundParameterData> *)pPVar3,SUB81(prepared_statement,0));
      tVar1.
      super__Tuple_impl<0UL,_duckdb::MaterializedQueryResult_*,_std::default_delete<duckdb::MaterializedQueryResult>_>
      .super__Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_duckdb::MaterializedQueryResult_*,_std::default_delete<duckdb::MaterializedQueryResult>_>
            )(_Tuple_impl<0UL,_duckdb::MaterializedQueryResult_*,_std::default_delete<duckdb::MaterializedQueryResult>_>
              )local_30._M_head_impl;
      local_30._M_head_impl = (MaterializedQueryResult *)0x0;
      *(_Tuple_impl<0UL,_duckdb::MaterializedQueryResult_*,_std::default_delete<duckdb::MaterializedQueryResult>_>
        *)this = tVar1.
                 super__Tuple_impl<0UL,_duckdb::MaterializedQueryResult_*,_std::default_delete<duckdb::MaterializedQueryResult>_>
                 .super__Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false>._M_head_impl;
      *out_result = this;
      this_00 = duckdb::
                unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                              *)this);
      bVar2 = duckdb::BaseQueryResult::HasError((BaseQueryResult *)this_00);
      if ((element_type *)local_30._M_head_impl != (element_type *)0x0) {
        (*(code *)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&(((((element_type *)local_30._M_head_impl)->
                            super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                            internal.
                            super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext>).
                          __weak_this_ + 8))->_M_pi)();
      }
      dVar4 = (duckdb_state)bVar2;
    }
  }
  return dVar4;
}

Assistant:

duckdb_state duckdb_execute_prepared_arrow(duckdb_prepared_statement prepared_statement, duckdb_arrow *out_result) {
	auto wrapper = reinterpret_cast<PreparedStatementWrapper *>(prepared_statement);
	if (!wrapper || !wrapper->statement || wrapper->statement->HasError() || !out_result) {
		return DuckDBError;
	}
	auto arrow_wrapper = new ArrowResultWrapper();
	auto result = wrapper->statement->Execute(wrapper->values, false);
	D_ASSERT(result->type == QueryResultType::MATERIALIZED_RESULT);
	arrow_wrapper->result = duckdb::unique_ptr_cast<QueryResult, MaterializedQueryResult>(std::move(result));
	*out_result = reinterpret_cast<duckdb_arrow>(arrow_wrapper);
	return !arrow_wrapper->result->HasError() ? DuckDBSuccess : DuckDBError;
}